

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaLoader.cpp
# Opt level: O3

void __thiscall
Assimp::ColladaLoader::BuildCamerasForNode
          (ColladaLoader *this,ColladaParser *pParser,Node *pNode,aiNode *pTarget)

{
  pointer *pppaVar1;
  uint uVar2;
  key_type *pkVar3;
  iterator __position;
  const_iterator cVar4;
  Logger *pLVar5;
  aiNode *paVar6;
  key_type *__k;
  float fVar7;
  float fVar8;
  aiCamera *out;
  char *local_1c8;
  char local_1b8 [16];
  aiNode *local_1a8 [14];
  ios_base local_138 [264];
  
  __k = &((pNode->mCameras).
          super__Vector_base<Assimp::Collada::CameraInstance,_std::allocator<Assimp::Collada::CameraInstance>_>
          ._M_impl.super__Vector_impl_data._M_start)->mCamera;
  pkVar3 = &((pNode->mCameras).
             super__Vector_base<Assimp::Collada::CameraInstance,_std::allocator<Assimp::Collada::CameraInstance>_>
             ._M_impl.super__Vector_impl_data._M_finish)->mCamera;
  if (__k != pkVar3) {
    do {
      cVar4 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Camera>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Camera>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Camera>_>_>
              ::find(&(pParser->mCameraLibrary)._M_t,__k);
      if ((_Rb_tree_header *)cVar4._M_node ==
          &(pParser->mCameraLibrary)._M_t._M_impl.super__Rb_tree_header) {
        pLVar5 = DefaultLogger::get();
        Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
        basic_formatter<char[40]>
                  ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8
                   ,(char (*) [40])"Collada: Unable to find camera for ID \"");
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,(__k->_M_dataplus)._M_p,__k->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\". Skipping.",0xc)
        ;
        std::__cxx11::stringbuf::str();
        Logger::warn(pLVar5,local_1c8);
        if (local_1c8 != local_1b8) {
          operator_delete(local_1c8);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
      }
      else {
        if ((char)cVar4._M_node[3]._M_color == _S_black) {
          pLVar5 = DefaultLogger::get();
          Logger::warn(pLVar5,"Collada: Orthographic cameras are not supported.");
        }
        paVar6 = (aiNode *)operator_new(0x438);
        (paVar6->mName).length = 0;
        (paVar6->mName).data[0] = '\0';
        memset((paVar6->mName).data + 1,0x1b,0x3ff);
        (paVar6->mTransformation).a1 = 0.0;
        (paVar6->mTransformation).a2 = 0.0;
        *(undefined8 *)&(paVar6->mTransformation).a3 = 0;
        *(undefined8 *)&(paVar6->mTransformation).b1 = 0x3f800000;
        (paVar6->mTransformation).b3 = 0.0;
        (paVar6->mTransformation).b4 = 0.0;
        *(undefined8 *)&(paVar6->mTransformation).c1 = 0x3f490fdb3f800000;
        *(undefined8 *)&(paVar6->mTransformation).c3 = 0x447a00003dcccccd;
        (paVar6->mTransformation).d1 = 0.0;
        local_1a8[0] = paVar6;
        if (paVar6 != pTarget) {
          uVar2 = (pTarget->mName).length;
          (paVar6->mName).length = uVar2;
          memcpy((paVar6->mName).data,(pTarget->mName).data,(ulong)uVar2);
          (paVar6->mName).data[uVar2] = '\0';
        }
        (paVar6->mTransformation).b3 = 0.0;
        (paVar6->mTransformation).b4 = 0.0;
        (paVar6->mTransformation).c1 = -1.0;
        (paVar6->mTransformation).c4 = *(float *)((long)&cVar4._M_node[3]._M_left + 4);
        (paVar6->mTransformation).c3 = *(float *)&cVar4._M_node[3]._M_left;
        fVar7 = *(float *)((long)&cVar4._M_node[3]._M_parent + 4);
        if ((fVar7 != 1e+11) || (NAN(fVar7))) {
          (paVar6->mTransformation).d1 = fVar7;
        }
        fVar7 = *(float *)&cVar4._M_node[3].field_0x4;
        if ((fVar7 != 1e+11) || (NAN(fVar7))) {
          (paVar6->mTransformation).c2 = fVar7;
          if ((((*(float *)&cVar4._M_node[3]._M_parent != 1e+11) ||
               (NAN(*(float *)&cVar4._M_node[3]._M_parent))) &&
              (fVar7 = *(float *)((long)&cVar4._M_node[3]._M_parent + 4), fVar7 == 1e+11)) &&
             (!NAN(fVar7))) {
            fVar7 = tanf(*(float *)&cVar4._M_node[3].field_0x4 * 0.017453292);
            fVar8 = tanf(*(float *)&cVar4._M_node[3]._M_parent * 0.017453292);
            (local_1a8[0]->mTransformation).d1 = fVar7 / fVar8;
            paVar6 = local_1a8[0];
          }
        }
        else {
          fVar7 = *(float *)((long)&cVar4._M_node[3]._M_parent + 4);
          if ((fVar7 != 1e+11) || (NAN(fVar7))) {
            fVar8 = *(float *)&cVar4._M_node[3]._M_parent;
            if ((fVar8 != 1e+11) || (NAN(fVar8))) {
              fVar8 = tanf(fVar8 * 0.017453292 * 0.5);
              fVar7 = atanf(fVar8 * fVar7);
              (local_1a8[0]->mTransformation).c2 = fVar7 * 57.29578 + fVar7 * 57.29578;
              paVar6 = local_1a8[0];
            }
          }
        }
        (paVar6->mTransformation).c2 = (paVar6->mTransformation).c2 * 0.017453292;
        __position._M_current =
             (this->mCameras).super__Vector_base<aiCamera_*,_std::allocator<aiCamera_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (this->mCameras).super__Vector_base<aiCamera_*,_std::allocator<aiCamera_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<aiCamera*,std::allocator<aiCamera*>>::_M_realloc_insert<aiCamera*const&>
                    ((vector<aiCamera*,std::allocator<aiCamera*>> *)&this->mCameras,__position,
                     (aiCamera **)local_1a8);
        }
        else {
          *__position._M_current = (aiCamera *)paVar6;
          pppaVar1 = &(this->mCameras).super__Vector_base<aiCamera_*,_std::allocator<aiCamera_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
          *pppaVar1 = *pppaVar1 + 1;
        }
      }
      __k = __k + 1;
    } while (__k != pkVar3);
  }
  return;
}

Assistant:

void ColladaLoader::BuildCamerasForNode(const ColladaParser& pParser, const Collada::Node* pNode, aiNode* pTarget) {
    for (const Collada::CameraInstance& cid : pNode->mCameras) {
        // find the referred light
        ColladaParser::CameraLibrary::const_iterator srcCameraIt = pParser.mCameraLibrary.find(cid.mCamera);
        if (srcCameraIt == pParser.mCameraLibrary.end()) {
            ASSIMP_LOG_WARN_F("Collada: Unable to find camera for ID \"", cid.mCamera, "\". Skipping.");
            continue;
        }
        const Collada::Camera* srcCamera = &srcCameraIt->second;

        // orthographic cameras not yet supported in Assimp
        if (srcCamera->mOrtho) {
            ASSIMP_LOG_WARN("Collada: Orthographic cameras are not supported.");
        }

        // now fill our ai data structure
        aiCamera* out = new aiCamera();
        out->mName = pTarget->mName;

        // collada cameras point in -Z by default, rest is specified in node transform
        out->mLookAt = aiVector3D(0.f, 0.f, -1.f);

        // near/far z is already ok
        out->mClipPlaneFar = srcCamera->mZFar;
        out->mClipPlaneNear = srcCamera->mZNear;

        // ... but for the rest some values are optional
        // and we need to compute the others in any combination.
        if (srcCamera->mAspect != 10e10f) {
            out->mAspect = srcCamera->mAspect;
        }

        if (srcCamera->mHorFov != 10e10f) {
            out->mHorizontalFOV = srcCamera->mHorFov;

            if (srcCamera->mVerFov != 10e10f && srcCamera->mAspect == 10e10f) {
                out->mAspect = std::tan(AI_DEG_TO_RAD(srcCamera->mHorFov)) /
                    std::tan(AI_DEG_TO_RAD(srcCamera->mVerFov));
            }

        } else if (srcCamera->mAspect != 10e10f && srcCamera->mVerFov != 10e10f)  {
            out->mHorizontalFOV = 2.0f * AI_RAD_TO_DEG(std::atan(srcCamera->mAspect *
                std::tan(AI_DEG_TO_RAD(srcCamera->mVerFov) * 0.5f)));
        }

        // Collada uses degrees, we use radians
        out->mHorizontalFOV = AI_DEG_TO_RAD(out->mHorizontalFOV);

        // add to camera list
        mCameras.push_back(out);
    }
}